

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qexception.cpp
# Opt level: O0

void __thiscall QtPrivate::ExceptionStore::rethrowException(ExceptionStore *this)

{
  undefined8 uVar1;
  long in_FS_OFFSET;
  exception_ptr *in_stack_ffffffffffffffc8;
  exception_ptr *in_stack_ffffffffffffffd0;
  undefined1 local_10 [8];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::__exception_ptr::exception_ptr::exception_ptr
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    uVar1 = std::rethrow_exception((exception_ptr)local_10);
    std::__exception_ptr::exception_ptr::~exception_ptr(in_stack_ffffffffffffffd0);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      _Unwind_Resume(uVar1);
    }
  }
  __stack_chk_fail();
}

Assistant:

void ExceptionStore::rethrowException() const
{
    Q_ASSERT(hasException());
    std::rethrow_exception(exceptionHolder);
}